

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

AppleAcceleratorTable *
getAccelTable<llvm::AppleAcceleratorTable>
          (unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           *Cache,DWARFObject *Obj,DWARFSection *Section,StringRef StringSection,bool IsLittleEndian
          )

{
  DataExtractor StringSection_00;
  bool bVar1;
  AppleAcceleratorTable *this;
  pointer pAVar2;
  Error local_d8;
  Error local_d0;
  Error E;
  undefined1 auStack_80 [8];
  DataExtractor StrData;
  DWARFDataExtractor AccelSection;
  bool IsLittleEndian_local;
  DWARFSection *Section_local;
  DWARFObject *Obj_local;
  unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  *Cache_local;
  StringRef StringSection_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)Cache);
  if (bVar1) {
    StringSection_local.Length =
         (size_t)std::
                 unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
                 ::operator*(Cache);
  }
  else {
    llvm::DWARFDataExtractor::DWARFDataExtractor
              ((DWARFDataExtractor *)&StrData.IsLittleEndian,Obj,Section,IsLittleEndian,'\0');
    llvm::DataExtractor::DataExtractor
              ((DataExtractor *)auStack_80,StringSection,IsLittleEndian,'\0');
    this = (AppleAcceleratorTable *)operator_new(0x90);
    StringSection_00.Data.Length = (size_t)StrData.Data.Data;
    StringSection_00.Data.Data = (char *)auStack_80;
    StringSection_00.IsLittleEndian = (undefined1)StrData.Data.Length;
    StringSection_00.AddressSize = StrData.Data.Length._1_1_;
    StringSection_00._18_6_ = StrData.Data.Length._2_6_;
    llvm::AppleAcceleratorTable::AppleAcceleratorTable
              (this,(DWARFDataExtractor *)&StrData.IsLittleEndian,StringSection_00);
    std::unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
    ::reset(Cache,this);
    pAVar2 = std::
             unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
             ::operator->(Cache);
    (*(pAVar2->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable[2])();
    bVar1 = llvm::Error::operator_cast_to_bool(&local_d0);
    if (bVar1) {
      llvm::Error::Error(&local_d8,&local_d0);
      llvm::consumeError(&local_d8);
      llvm::Error::~Error(&local_d8);
    }
    llvm::Error::~Error(&local_d0);
    StringSection_local.Length =
         (size_t)std::
                 unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
                 ::operator*(Cache);
  }
  return (AppleAcceleratorTable *)StringSection_local.Length;
}

Assistant:

static T &getAccelTable(std::unique_ptr<T> &Cache, const DWARFObject &Obj,
                        const DWARFSection &Section, StringRef StringSection,
                        bool IsLittleEndian) {
  if (Cache)
    return *Cache;
  DWARFDataExtractor AccelSection(Obj, Section, IsLittleEndian, 0);
  DataExtractor StrData(StringSection, IsLittleEndian, 0);
  Cache.reset(new T(AccelSection, StrData));
  if (Error E = Cache->extract())
    llvm::consumeError(std::move(E));
  return *Cache;
}